

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDA.cpp
# Opt level: O2

bool __thiscall PDA::inStackAlphabet(PDA *this,string *c)

{
  pointer pbVar1;
  __type _Var2;
  bool bVar3;
  pointer pbVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> a;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_48;
  
  pbVar4 = (this->stackAlphabetG).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (this->stackAlphabetG).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (pbVar4 == pbVar1) {
LAB_001157aa:
      return pbVar4 != pbVar1;
    }
    std::__cxx11::string::string((string *)&bStack_48,(string *)pbVar4);
    _Var2 = std::operator==(&bStack_48,c);
    if (_Var2) {
LAB_001157a2:
      std::__cxx11::string::~string((string *)&bStack_48);
      goto LAB_001157aa;
    }
    bVar3 = std::operator==(c,"e");
    if (bVar3) goto LAB_001157a2;
    std::__cxx11::string::~string((string *)&bStack_48);
    pbVar4 = pbVar4 + 1;
  } while( true );
}

Assistant:

bool PDA::inStackAlphabet(std::string c) {
    for (auto a: stackAlphabetG) {
        if (a == c or c == "e") {
            return true;
        }
    }
    return false;
}